

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O3

void __thiscall
Js::BoundFunction::BoundFunction(BoundFunction *this,Arguments *args,DynamicType *type)

{
  Type *addr;
  Type *addr_00;
  Type *addr_01;
  char *addr_02;
  ScriptContext *requestContext;
  code *pcVar1;
  type_info *ptVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  DynamicTypeHandler *pDVar10;
  Recycler *this_00;
  WriteBarrierPtr<void> *pWVar11;
  type_info *ptVar12;
  size_t size;
  long lVar13;
  ulong uVar14;
  Arguments *pAVar15;
  undefined **local_70;
  Var varLength;
  ulong local_60;
  char *local_58;
  DWORD local_50;
  type_info *local_48;
  Arguments *local_40;
  ScriptContext *local_38;
  
  JavascriptFunction::JavascriptFunction
            (&this->super_JavascriptFunction,type,(FunctionInfo *)functionInfo);
  (this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014f1650;
  (this->boundArgs).ptr = (WriteBarrierPtr<void> *)0x0;
  (this->targetFunction).ptr = (RecyclableObject *)0x0;
  (this->boundThis).ptr = (void *)0x0;
  this->count = 0;
  JavascriptFunction::VerifyEntryPoint(&this->super_JavascriptFunction);
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x1c,"(args.Info.Count > 0)",
                                "wrong number of args in BoundFunction");
    if (!bVar3) goto LAB_00b26609;
    *puVar7 = 0;
  }
  addr = &this->targetFunction;
  requestContext =
       (((((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.ptr)->
         javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  local_40 = args;
  pvVar8 = Arguments::operator[](args,0);
  pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
  Memory::Recycler::WBSetBit((char *)addr);
  (this->targetFunction).ptr = pRVar9;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  local_38 = requestContext;
  BVar4 = CrossSite::NeedMarshalVar((this->targetFunction).ptr,requestContext);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x21,"(!CrossSite::NeedMarshalVar(targetFunction, scriptContext))",
                                "!CrossSite::NeedMarshalVar(targetFunction, scriptContext)");
    if (!bVar3) goto LAB_00b26609;
    *puVar7 = 0;
  }
  pRVar9 = JavascriptOperators::GetPrototype(addr->ptr);
  if (pRVar9 != (type->super_Type).prototype.ptr) {
    if (type->isShared == true) {
      DynamicObject::ChangeType((DynamicObject *)this);
      type = (DynamicType *)
             (this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.ptr;
    }
    addr_00 = &(type->super_Type).prototype;
    Memory::Recycler::WBSetBit((char *)addr_00);
    (type->super_Type).prototype.ptr = pRVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  }
  pAVar15 = local_40;
  BVar4 = JavascriptOperators::HasOwnProperty(addr->ptr,0xd1,local_38,(PropertyString *)0x0);
  ptVar12 = (type_info *)0x0;
  if (BVar4 == 1) {
    pRVar9 = addr->ptr;
    iVar5 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x12])
                      (pRVar9,pRVar9,0xd1,&stack0xffffffffffffff90,0,local_38);
    ptVar2 = (type_info *)local_70;
    ptVar12 = (type_info *)0x0;
    if (iVar5 == 1) {
      uVar14 = (ulong)local_70 & 0x1ffff00000000;
      if (uVar14 == 0x1000000000000 || ((ulong)local_70 & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)local_70 & 0xffff000000000000) != 0x1000000000000) {
          uVar6 = JavascriptConversion::ToInt32_Full(local_70,local_38);
          ptVar12 = (type_info *)(ulong)uVar6;
          pAVar15 = local_40;
          goto LAB_00b2636f;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00b26609;
        *puVar7 = 0;
      }
      pAVar15 = local_40;
      ptVar12 = ptVar2;
      if (uVar14 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00b26609;
        *puVar7 = 0;
      }
    }
  }
LAB_00b2636f:
  addr_01 = &this->boundThis;
  pDVar10 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  (*pDVar10->_vptr_DynamicTypeHandler[0x10])(pDVar10,this);
  if (((ulong)pAVar15->Info & 0xfffffe) == 0) {
    pRVar9 = (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
    Memory::Recycler::WBSetBit((char *)addr_01);
    (this->boundThis).ptr = pRVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
    uVar6 = this->count;
  }
  else {
    pvVar8 = Arguments::operator[](pAVar15,1);
    Memory::Recycler::WBSetBit((char *)addr_01);
    pAVar15 = local_40;
    (this->boundThis).ptr = pvVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
    uVar6 = (*(uint *)&pAVar15->Info & 0xffffff) - 2;
    this->count = uVar6;
    if ((*(uint *)&pAVar15->Info & 0xffffff) < 3) goto LAB_00b265c5;
    local_60 = (ulong)uVar6;
    local_70 = &Memory::WriteBarrierPtr<void>::typeinfo;
    varLength = (Var)0x0;
    local_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
    ;
    local_50 = 0x47;
    local_48 = ptVar12;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (local_38->recycler,(TrackAllocData *)&stack0xffffffffffffff90);
    uVar6 = this->count;
    if ((ulong)uVar6 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      pWVar11 = (WriteBarrierPtr<void> *)&DAT_00000008;
    }
    else {
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00b26609;
        *puVar7 = 0;
      }
      size = (ulong)uVar6 << 3;
      pWVar11 = (WriteBarrierPtr<void> *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                          (this_00,size);
      if (pWVar11 == (WriteBarrierPtr<void> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_00b26609:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
      memset(pWVar11,0,size);
    }
    Memory::Recycler::WBSetBit((char *)&this->boundArgs);
    (this->boundArgs).ptr = pWVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->boundArgs);
    if (this->count == 0) {
      uVar6 = 0;
      ptVar12 = local_48;
    }
    else {
      lVar13 = 0;
      uVar14 = 0;
      do {
        local_38 = (ScriptContext *)Arguments::operator[](local_40,(int)uVar14 + 2);
        pWVar11 = (this->boundArgs).ptr;
        addr_02 = (char *)((long)&pWVar11->ptr + lVar13);
        Memory::Recycler::WBSetBit(addr_02);
        *(ScriptContext **)((long)&pWVar11->ptr + lVar13) = local_38;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_02);
        uVar14 = uVar14 + 1;
        uVar6 = this->count;
        lVar13 = lVar13 + 8;
        ptVar12 = local_48;
      } while (uVar14 < uVar6);
    }
  }
LAB_00b265c5:
  uVar6 = (int)ptVar12 - uVar6;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (this,0xd1,(ulong)uVar6 | 0x1000000000000,2,0,0,0);
  return;
}

Assistant:

BoundFunction::BoundFunction(Arguments args, DynamicType * type)
        : JavascriptFunction(type, &functionInfo),
        count(0),
        boundArgs(nullptr)
    {
        DebugOnly(VerifyEntryPoint());
        AssertMsg(args.Info.Count > 0, "wrong number of args in BoundFunction");

        ScriptContext *scriptContext = this->GetScriptContext();
        targetFunction = VarTo<RecyclableObject>(args[0]);

        Assert(!CrossSite::NeedMarshalVar(targetFunction, scriptContext));

        // Let proto be targetFunction.[[GetPrototypeOf]]().
        RecyclableObject* proto = JavascriptOperators::GetPrototype(targetFunction);
        if (proto != type->GetPrototype())
        {
            if (type->GetIsShared())
            {
                this->ChangeType();
                type = this->GetDynamicType();
            }
            type->SetPrototype(proto);
        }

        int len = 0;
        // If targetFunction is proxy, need to make sure that traps are called in right order as per 19.2.3.2 in RC#4 dated April 3rd 2015.
        // additionally need to get the correct length value for the boundFunctions' length property
        if (JavascriptOperators::HasOwnProperty(targetFunction, PropertyIds::length, scriptContext, nullptr) == TRUE)
        {
            Var varLength;
            if (targetFunction->GetProperty(targetFunction, PropertyIds::length, &varLength, nullptr, scriptContext))
            {
                len = JavascriptConversion::ToInt32(varLength, scriptContext);
            }
        }
        GetTypeHandler()->EnsureObjectReady(this);

        if (args.Info.Count > 1)
        {
            boundThis = args[1];

            // function object and "this" arg
            const uint countAccountedFor = 2;
            count = args.Info.Count - countAccountedFor;

            // Store the args excluding function obj and "this" arg
            if (args.Info.Count > 2)
            {
                boundArgs = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), count);

                for (uint i=0; i<count; i++)
                {
                    boundArgs[i] = args[i+countAccountedFor];
                }
            }
        }
        else
        {
            // If no "this" is passed, "undefined" is used
            boundThis = scriptContext->GetLibrary()->GetUndefined();
        }

        // Reduce length number of bound args
        len = len - this->count;
        len = max(len, 0);

        SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(len), PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);
    }